

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
cppcms::widgets::select_multiple::render_input(select_multiple *this,form_context *context)

{
  ostream *out;
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  void *p;
  pointer peVar5;
  char *pcVar6;
  bool bVar7;
  escape local_80;
  form_context *local_58;
  streamable local_50;
  
  base_widget::auto_generate(&this->super_base_widget,context);
  out = form_context::out(context);
  if (context->widget_part_type_ == 0) {
    if (context->html_type_ == 1) {
      pcVar6 = "<select multiple=\"multiple\" ";
      lVar3 = 0x1c;
    }
    else {
      pcVar6 = "<select multiple ";
      lVar3 = 0x11;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar3);
    if (this->rows_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out," size=\"",7);
      local_80.obj_.ptr_._0_4_ = this->rows_;
      impl::details::write_int_to_stream<unsigned_int>::operator()
                ((write_int_to_stream<unsigned_int> *)&local_80,out);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\" ",2);
    }
    (*(this->super_base_widget).super_base_form._vptr_base_form[9])(this,context);
  }
  else {
    local_58 = context;
    std::__ostream_insert<char,std::char_traits<char>>(out," >\n",3);
    peVar5 = (this->elements_).
             super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->elements_).
        super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
        ._M_impl.super__Vector_impl_data._M_finish != peVar5) {
      uVar2 = 0;
      uVar4 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"<option value=\"",0xf);
        util::escape((string *)&local_80,&peVar5[uVar2].id);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(char *)CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_),
                            (long)local_80.obj_.to_stream_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
        if ((to_string_type *)CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_) !=
            &local_80.obj_.to_string_) {
          operator_delete((undefined1 *)CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_))
          ;
        }
        peVar5 = peVar5 + uVar2;
        if ((undefined1  [200])((undefined1  [200])*peVar5 & (undefined1  [200])0x1) !=
            (undefined1  [200])0x0) {
          if (local_58->html_type_ == 1) {
            lVar3 = 0x14;
            pcVar6 = "selected=\"selected\" ";
          }
          else {
            lVar3 = 9;
            pcVar6 = "selected ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,">",1);
        if ((undefined1  [200])((undefined1  [200])*peVar5 & (undefined1  [200])0x2) ==
            (undefined1  [200])0x0) {
          util::escape((string *)&local_80,&peVar5->str_option);
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,(char *)CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_),
                     (long)local_80.obj_.to_stream_);
          if ((to_string_type *)CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_) !=
              &local_80.obj_.to_string_) {
            operator_delete((undefined1 *)
                            CONCAT44(local_80.obj_.ptr_._4_4_,(uint)local_80.obj_.ptr_));
          }
        }
        else {
          filters::streamable::set
                    (&local_50,&peVar5->tr_option,
                     filters::streamable::to_stream<booster::locale::basic_message<char>>,
                     filters::streamable::to_string<booster::locale::basic_message<char>>,
                     (type_info *)&booster::locale::basic_message<char>::typeinfo);
          filters::escape::escape(&local_80,&local_50);
          filters::escape::operator()(&local_80,out);
          filters::escape::~escape(&local_80);
          filters::streamable::~streamable(&local_50);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"</option>\n",10);
        peVar5 = (this->elements_).
                 super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(this->elements_).
                       super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5 >> 3) *
                -0x70a3d70a3d70a3d7;
        bVar7 = uVar4 <= uVar2;
        lVar3 = uVar2 - uVar4;
        uVar2 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar7 && lVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"</select>",9);
  }
  return;
}

Assistant:

void select_multiple::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		if(context.html() == as_xhtml)
			out<<"<select multiple=\"multiple\" ";
		else
			out<<"<select multiple ";
		if(rows_ > 0)
			out << " size=\"" << cint(rows_) << "\" ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(el.selected) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}